

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O2

int64_t av1_highbd_pixel_proj_error_c
                  (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
                  int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int *xq,
                  sgr_params_type *params)

{
  ushort uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  
  lVar8 = (long)src8 * 2;
  lVar9 = (long)dat8 * 2;
  if (params->r[0] < 1) {
    if (params->r[1] < 1) {
      uVar3 = 0;
      uVar6 = (ulong)(uint)width;
      if (width < 1) {
        uVar6 = uVar3;
      }
      if (height < 1) {
        height = 0;
      }
      for (iVar7 = 0; iVar7 != height; iVar7 = iVar7 + 1) {
        for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
          lVar2 = (ulong)*(ushort *)(lVar9 + uVar10 * 2) - (ulong)*(ushort *)(lVar8 + uVar10 * 2);
          uVar3 = uVar3 + lVar2 * lVar2;
        }
        lVar8 = lVar8 + (long)src_stride * 2;
        lVar9 = lVar9 + (long)dat_stride * 2;
      }
      return uVar3;
    }
    uVar6 = 4;
    flt0 = flt1;
    flt0_stride = flt1_stride;
  }
  else {
    uVar6 = 0;
    if (0 < params->r[1]) {
      uVar3 = (ulong)(uint)width;
      if (width < 1) {
        uVar3 = uVar6;
      }
      if (height < 1) {
        height = 0;
      }
      lVar2 = 0;
      for (; (int)uVar6 != height; uVar6 = (ulong)((int)uVar6 + 1)) {
        for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
          uVar1 = *(ushort *)(lVar9 + uVar10 * 2);
          lVar4 = (long)(int)(((uint)uVar1 - (uint)*(ushort *)(lVar8 + uVar10 * 2)) +
                             ((int)((flt0[uVar10] + (uint)uVar1 * -0x10) * *xq +
                                    (flt1[uVar10] + (uint)uVar1 * -0x10) * xq[1] + 0x400) >> 0xb));
          lVar2 = lVar2 + lVar4 * lVar4;
        }
        flt1 = flt1 + flt1_stride;
        flt0 = flt0 + flt0_stride;
        lVar8 = lVar8 + (long)src_stride * 2;
        lVar9 = lVar9 + (long)dat_stride * 2;
      }
      return lVar2;
    }
  }
  uVar10 = 0;
  uVar3 = (ulong)(uint)width;
  if (width < 1) {
    uVar3 = uVar10;
  }
  if (height < 1) {
    height = 0;
  }
  for (iVar7 = 0; iVar7 != height; iVar7 = iVar7 + 1) {
    for (uVar11 = 0; uVar3 != uVar11; uVar11 = uVar11 + 1) {
      uVar5 = (uint)*(ushort *)(lVar9 + uVar11 * 2);
      lVar2 = (long)(int)((uVar5 - *(ushort *)(lVar8 + uVar11 * 2)) +
                         ((int)((flt0[uVar11] + uVar5 * -0x10) * *(int *)((long)xq + uVar6) + 0x400)
                         >> 0xb));
      uVar10 = uVar10 + lVar2 * lVar2;
    }
    flt0 = flt0 + flt0_stride;
    lVar8 = lVar8 + (long)src_stride * 2;
    lVar9 = lVar9 + (long)dat_stride * 2;
  }
  return uVar10;
}

Assistant:

int64_t av1_highbd_pixel_proj_error_c(const uint8_t *src8, int width,
                                      int height, int src_stride,
                                      const uint8_t *dat8, int dat_stride,
                                      int32_t *flt0, int flt0_stride,
                                      int32_t *flt1, int flt1_stride, int xq[2],
                                      const sgr_params_type *params) {
  const uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  const uint16_t *dat = CONVERT_TO_SHORTPTR(dat8);
  int i, j;
  int64_t err = 0;
  const int32_t half = 1 << (SGRPROJ_RST_BITS + SGRPROJ_PRJ_BITS - 1);
  if (params->r[0] > 0 && params->r[1] > 0) {
    int xq0 = xq[0];
    int xq1 = xq[1];
    for (i = 0; i < height; ++i) {
      for (j = 0; j < width; ++j) {
        const int32_t d = dat[j];
        const int32_t s = src[j];
        const int32_t u = (int32_t)(d << SGRPROJ_RST_BITS);
        int32_t v0 = flt0[j] - u;
        int32_t v1 = flt1[j] - u;
        int32_t v = half;
        v += xq0 * v0;
        v += xq1 * v1;
        const int32_t e = (v >> (SGRPROJ_RST_BITS + SGRPROJ_PRJ_BITS)) + d - s;
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      flt0 += flt0_stride;
      flt1 += flt1_stride;
      src += src_stride;
    }
  } else if (params->r[0] > 0 || params->r[1] > 0) {
    int exq;
    int32_t *flt;
    int flt_stride;
    if (params->r[0] > 0) {
      exq = xq[0];
      flt = flt0;
      flt_stride = flt0_stride;
    } else {
      exq = xq[1];
      flt = flt1;
      flt_stride = flt1_stride;
    }
    for (i = 0; i < height; ++i) {
      for (j = 0; j < width; ++j) {
        const int32_t d = dat[j];
        const int32_t s = src[j];
        const int32_t u = (int32_t)(d << SGRPROJ_RST_BITS);
        int32_t v = half;
        v += exq * (flt[j] - u);
        const int32_t e = (v >> (SGRPROJ_RST_BITS + SGRPROJ_PRJ_BITS)) + d - s;
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      flt += flt_stride;
      src += src_stride;
    }
  } else {
    for (i = 0; i < height; ++i) {
      for (j = 0; j < width; ++j) {
        const int32_t d = dat[j];
        const int32_t s = src[j];
        const int32_t e = d - s;
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
    }
  }
  return err;
}